

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_SVM_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_003cb1a0 == '\x01') {
    DAT_003cb1a0 = '\0';
    (*(code *)*_LinearKernel_default_instance_)();
  }
  if (DAT_003cb1c8 == '\x01') {
    DAT_003cb1c8 = '\0';
    (*(code *)*_RBFKernel_default_instance_)();
  }
  if (DAT_003cb1f8 == '\x01') {
    DAT_003cb1f8 = '\0';
    (*(code *)*_PolyKernel_default_instance_)();
  }
  if (DAT_003cb228 == '\x01') {
    DAT_003cb228 = '\0';
    (*(code *)*_SigmoidKernel_default_instance_)();
  }
  if (DAT_003cb250 == '\x01') {
    DAT_003cb250 = '\0';
    (*(code *)*_Kernel_default_instance_)();
  }
  if (DAT_003cb298 == '\x01') {
    DAT_003cb298 = '\0';
    (*(code *)*_SparseNode_default_instance_)();
  }
  if (DAT_003cb2d0 == '\x01') {
    DAT_003cb2d0 = '\0';
    (*(code *)*_SparseVector_default_instance_)();
  }
  if (DAT_003cb308 == '\x01') {
    DAT_003cb308 = '\0';
    (*(code *)*_SparseSupportVectors_default_instance_)();
  }
  if (DAT_003cb338 == '\x01') {
    DAT_003cb338 = '\0';
    (*(code *)*_DenseVector_default_instance_)();
  }
  if (DAT_003cb370 == '\x01') {
    DAT_003cb370 = '\0';
    (*(code *)*_DenseSupportVectors_default_instance_)();
  }
  if (DAT_003cb3a0 == '\x01') {
    DAT_003cb3a0 = '\0';
    (*(code *)*_Coefficients_default_instance_)();
  }
  if (DAT_003cb3e0 == '\x01') {
    DAT_003cb3e0 = '\0';
    (*(code *)*_SupportVectorRegressor_default_instance_)();
  }
  if (DAT_003cb4a8 == '\x01') {
    DAT_003cb4a8 = 0;
    (*(code *)*_SupportVectorClassifier_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _LinearKernel_default_instance_.Shutdown();
  _RBFKernel_default_instance_.Shutdown();
  _PolyKernel_default_instance_.Shutdown();
  _SigmoidKernel_default_instance_.Shutdown();
  _Kernel_default_instance_.Shutdown();
  _SparseNode_default_instance_.Shutdown();
  _SparseVector_default_instance_.Shutdown();
  _SparseSupportVectors_default_instance_.Shutdown();
  _DenseVector_default_instance_.Shutdown();
  _DenseSupportVectors_default_instance_.Shutdown();
  _Coefficients_default_instance_.Shutdown();
  _SupportVectorRegressor_default_instance_.Shutdown();
  _SupportVectorClassifier_default_instance_.Shutdown();
}